

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

void botpHOTPStepR(char *otp,void *state)

{
  char *count;
  octet *mac;
  size_t sVar1;
  octet *mac_00;
  char *in_RSI;
  botp_hotp_st *st;
  void *in_stack_ffffffffffffffc8;
  char *otp_00;
  
  count = in_RSI + 0x42;
  mac = (octet *)(in_RSI + 0x42);
  otp_00 = in_RSI;
  sVar1 = beltHMAC_keep();
  mac_00 = mac + sVar1;
  beltHMAC_keep();
  memCopy(mac,in_stack_ffffffffffffffc8,0x15a544);
  beltHMACStepA(mac_00,(size_t)count,mac);
  beltHMACStepG(mac,in_stack_ffffffffffffffc8);
  botpDT(otp_00,(size_t)in_RSI,mac_00,(size_t)count);
  botpCtrNext((octet *)(in_RSI + 8));
  return;
}

Assistant:

void botpHOTPStepR(char* otp, void* state)
{
	botp_hotp_st* st = (botp_hotp_st*)state;
	// pre
	ASSERT(memIsDisjoint2(otp, st->digit + 1, state, botpHOTP_keep()) || 
		otp == st->otp);
	// вычислить имитовставку
	memCopy(st->stack, st->stack + beltHMAC_keep(), beltHMAC_keep());
	beltHMACStepA(st->ctr, 8, st->stack);
	beltHMACStepG(st->mac, st->stack);
	// построить пароль
	botpDT(otp, st->digit, st->mac, 32);
	// инкремент счетчика
	botpCtrNext(st->ctr);
}